

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall
Catch::Detail::unique_ptr<Catch::Detail::EnumInfo>::~unique_ptr
          (unique_ptr<Catch::Detail::EnumInfo> *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    EnumInfo::~EnumInfo((EnumInfo *)0x1cff76);
    operator_delete(pvVar1,0x28);
  }
  return;
}

Assistant:

~unique_ptr() {
            delete m_ptr;
        }